

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains_or_position.hpp
# Opt level: O2

idx_t duckdb::ListSearchNestedOp<true>
                (Vector *list_vec,Vector *source_vec,Vector *target_vec,Vector *result_vec,
                idx_t target_count)

{
  idx_t iVar1;
  OrderModifiers order_modifiers;
  LogicalType local_130;
  LogicalType local_118;
  Vector target_sort_key_vec;
  Vector source_sort_key_vec;
  
  iVar1 = ListVector::GetListSize(list_vec);
  LogicalType::LogicalType(&local_118,BLOB);
  Vector::Vector(&source_sort_key_vec,&local_118,iVar1);
  LogicalType::~LogicalType(&local_118);
  LogicalType::LogicalType(&local_130,BLOB);
  Vector::Vector(&target_sort_key_vec,&local_130,target_count);
  LogicalType::~LogicalType(&local_130);
  order_modifiers.order_type = ASCENDING;
  order_modifiers.null_type = NULLS_LAST;
  CreateSortKeyHelpers::CreateSortKeyWithValidity
            (source_vec,&source_sort_key_vec,&order_modifiers,iVar1);
  CreateSortKeyHelpers::CreateSortKeyWithValidity
            (target_vec,&target_sort_key_vec,&order_modifiers,target_count);
  iVar1 = ListSearchSimpleOp<duckdb::string_t,true>
                    (list_vec,&source_sort_key_vec,&target_sort_key_vec,result_vec,target_count);
  Vector::~Vector(&target_sort_key_vec);
  Vector::~Vector(&source_sort_key_vec);
  return iVar1;
}

Assistant:

idx_t ListSearchNestedOp(Vector &list_vec, Vector &source_vec, Vector &target_vec, Vector &result_vec,
                         const idx_t target_count) {
	// Set up sort keys for nested types.
	auto source_count = ListVector::GetListSize(list_vec);
	Vector source_sort_key_vec(LogicalType::BLOB, source_count);
	Vector target_sort_key_vec(LogicalType::BLOB, target_count);

	const OrderModifiers order_modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);
	CreateSortKeyHelpers::CreateSortKeyWithValidity(source_vec, source_sort_key_vec, order_modifiers, source_count);
	CreateSortKeyHelpers::CreateSortKeyWithValidity(target_vec, target_sort_key_vec, order_modifiers, target_count);

	return ListSearchSimpleOp<string_t, RETURN_POSITION>(list_vec, source_sort_key_vec, target_sort_key_vec, result_vec,
	                                                     target_count);
}